

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall glcts::NegativeUBO::Run(NegativeUBO *this)

{
  bool bVar1;
  GLuint GVar2;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  NegativeUBO *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nuniform Block {\n  uniform atomic_uint ac_counter;\n};\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter);\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;\nuniform Block {\n  uniform atomic_uint ac_counter;\n};\nlayout(std430) buffer Output {\n  mediump uint data_inc[256];\n} g_out;\nvoid main() {\n  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter);\n}"
             ,&local_41);
  GVar2 = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_40);
  *(GLuint *)&(this->super_BasicUsageCS).field_0x34 = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
  bVar1 = BasicUsageCS::CheckProgram
                    (&this->super_BasicUsageCS,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,
                     (bool *)0x0);
  if (bVar1) {
    glcts::anon_unknown_0::Output
              ("Link should fail because atomic counters cannot be declared in the uniform block.\n"
              );
    this_local = (NegativeUBO *)&DAT_ffffffffffffffff;
  }
  else {
    this_local = (NegativeUBO *)0x0;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 8, local_size_y = 8, local_size_z = 1) in;" NL "uniform Block {" NL
			   "  uniform atomic_uint ac_counter;" NL "};" NL "layout(std430) buffer Output {" NL
			   "  mediump uint data_inc[256];" NL "} g_out;" NL "void main() {" NL
			   "  mediump uint offset = 32u * gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;" NL
			   "  g_out.data_inc[offset] = atomicCounterIncrement(ac_counter);" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (CheckProgram(prog_))
		{
			Output("Link should fail because atomic counters cannot be declared in the uniform block.\n");
			return ERROR;
		}
		return NO_ERROR;
	}